

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

bool __thiscall Lexer::token(Lexer *this,string *token,Type *type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  pointer pcVar3;
  size_t sVar4;
  size_t marker;
  string local_50;
  size_t local_30;
  
  pcVar3 = (this->_text)._M_dataplus._M_p;
  sVar4 = this->_cursor;
  while (bVar2 = unicodeWhitespace((int)pcVar3[sVar4]), bVar2) {
    utf8_next_char(&this->_text,&this->_cursor);
    pcVar3 = (this->_text)._M_dataplus._M_p;
    sVar4 = this->_cursor;
  }
  if (this->_eos <= this->_cursor) {
    return false;
  }
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\'\"","");
  if (this->_enableString == true) {
    local_30 = this->_cursor;
    bVar2 = readWord(&this->_text,&local_50,&local_30,token);
    if (bVar2) {
      *type = string;
      this->_cursor = local_30;
      goto LAB_00104f60;
    }
  }
  bVar2 = isUUID(this,token,type,true);
  if ((((((!bVar2) && (bVar2 = isDate(this,token,type), !bVar2)) &&
        (bVar2 = isDuration(this,token,type), !bVar2)) &&
       ((bVar2 = isURL(this,token,type), !bVar2 && (bVar2 = isHexNumber(this,token,type), !bVar2))))
      && ((bVar2 = isNumber(this,token,type), !bVar2 &&
          ((bVar2 = isPath(this,token,type), !bVar2 && (bVar2 = isPattern(this,token,type), !bVar2))
          )))) && (bVar2 = isOperator(this,token,type), !bVar2)) {
    bVar2 = isWord(this,token,type);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == paVar1) {
      return bVar2;
    }
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    return bVar2;
  }
LAB_00104f60:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool Lexer::token (std::string& token, Lexer::Type& type)
{
  // Eat white space.
  while (unicodeWhitespace (_text[_cursor]))
    utf8_next_char (_text, _cursor);

  // Terminate at EOS.
  if (isEOS ())
    return false;

  if (isString    (token, type, "'\"") ||
      isUUID      (token, type, true)  ||
      isDate      (token, type)        ||
      isDuration  (token, type)        ||
      isURL       (token, type)        ||
      isHexNumber (token, type)        ||
      isNumber    (token, type)        ||
      isPath      (token, type)        ||
      isPattern   (token, type)        ||
      isOperator  (token, type)        ||
      isWord      (token, type))
    return true;

  return false;
}